

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O3

bool __thiscall
S2MaxDistanceShapeIndexTarget::UpdateMinDistance
          (S2MaxDistanceShapeIndexTarget *this,S2Point *v0,S2Point *v1,S2MaxDistance *min_dist)

{
  S2FurthestEdgeQuery *this_00;
  Result RVar1;
  Target local_40;
  VType local_38;
  VType VStack_30;
  VType local_28;
  VType local_20;
  VType VStack_18;
  VType local_10;
  
  this_00 = (this->query_)._M_t.
            super___uniq_ptr_impl<S2FurthestEdgeQuery,_std::default_delete<S2FurthestEdgeQuery>_>.
            _M_t.
            super__Tuple_impl<0UL,_S2FurthestEdgeQuery_*,_std::default_delete<S2FurthestEdgeQuery>_>
            .super__Head_base<0UL,_S2FurthestEdgeQuery_*,_false>._M_head_impl;
  *(double *)&(this_00->options_).super_Options = (min_dist->distance_).length2_;
  local_28 = v0->c_[2];
  local_38 = v0->c_[0];
  VStack_30 = v0->c_[1];
  local_20 = v1->c_[0];
  VStack_18 = v1->c_[1];
  local_10 = v1->c_[2];
  local_40._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_002bbf28;
  RVar1 = S2FurthestEdgeQuery::FindFurthestEdge(this_00,&local_40);
  if (-1 < RVar1.shape_id_) {
    (min_dist->distance_).length2_ = RVar1.distance_.length2_.length2_;
  }
  return -1 < RVar1.shape_id_;
}

Assistant:

bool S2MaxDistanceShapeIndexTarget::UpdateMinDistance(
    const S2Point& v0, const S2Point& v1, S2MaxDistance* min_dist) {
  query_->mutable_options()->set_min_distance(S1ChordAngle(*min_dist));
  S2FurthestEdgeQuery::EdgeTarget target(v0, v1);
  S2FurthestEdgeQuery::Result r = query_->FindFurthestEdge(&target);
  if (r.shape_id() < 0) return false;
  *min_dist = S2MaxDistance(r.distance());
  return true;
}